

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_18::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  pointer *ppIVar1;
  int iVar2;
  InliningMode IVar3;
  mapped_type mVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  PassRunner *pPVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  PassRunner *pPVar13;
  FunctionSplitter *pFVar14;
  TaskFunc p_Var15;
  size_t sVar16;
  pointer pIVar17;
  _Hash_node_base *p_Var18;
  __buckets_ptr pp_Var19;
  uintptr_t uVar20;
  Expression *pEVar21;
  pointer pIVar22;
  pointer pIVar23;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var24;
  undefined8 *puVar25;
  string_view sVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  char *pcVar30;
  bool bVar31;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var32;
  __node_base *p_Var33;
  size_type *psVar34;
  undefined3 uVar35;
  __node_base_ptr p_Var36;
  pointer pNVar37;
  __buckets_ptr pp_Var38;
  bool bVar39;
  char cVar40;
  Id IVar41;
  Index IVar42;
  mapped_type *pmVar43;
  FunctionSplitter *pFVar44;
  Function *pFVar45;
  BranchSeeker *this_01;
  __node_ptr p_Var46;
  Global *__s;
  __node_base_ptr *pp_Var47;
  Function *pFVar48;
  size_type sVar49;
  mapped_type *pmVar50;
  _Hash_node_base *builder_00;
  __node_base_ptr *__s_00;
  __node_base_ptr *pp_Var51;
  Function *pFVar52;
  Function *pFVar53;
  undefined1 *puVar54;
  Unary *this_02;
  Call *pCVar55;
  pointer pIVar56;
  mapped_type *pmVar57;
  uint uVar58;
  char *pcVar59;
  _Hash_node_base _Var60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *builder_01;
  ulong uVar62;
  pointer pIVar63;
  BranchSeeker *tree;
  key_type *__key;
  __buckets_ptr __n;
  ulong uVar64;
  size_type __n_00;
  Type TVar65;
  pointer pIVar66;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  ulong uVar67;
  pointer puVar68;
  pointer puVar69;
  long *plVar70;
  undefined8 *puVar71;
  undefined1 auVar72 [8];
  Module *pMVar73;
  BranchSeeker *this_03;
  BranchSeeker *tree_00;
  __node_base _Var74;
  Module *pMVar75;
  _Hash_node_base *p_Var76;
  uint uVar77;
  pointer puVar78;
  Expression **ppEVar79;
  Expression *pEVar80;
  __node_base_ptr p_Var81;
  long lVar82;
  pointer pIVar83;
  char cVar84;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar85;
  pointer puVar86;
  Expression **ppEVar87;
  _Hash_node_base *p_Var88;
  BranchSeeker *pBVar89;
  _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
  *this_04;
  Iterator start_it;
  Signature SVar90;
  undefined1 auVar91 [16];
  Signature SVar92;
  Iterator end_it;
  Name NVar93;
  undefined1 local_418 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  __buckets_alloc_type __alloc;
  __node_base local_398;
  code *pcStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_378;
  undefined1 local_358;
  Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
  local_350;
  NameInfoMap *pNStack_278;
  undefined1 *local_270;
  undefined1 local_260 [8];
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  undefined1 auStack_208 [8];
  Name name;
  pointer local_1e8;
  undefined4 local_1e0;
  undefined1 local_1dc;
  string local_1d8;
  undefined1 auStack_1b8 [8];
  Name inlinedName;
  Module *local_190;
  Function *func_2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 local_168 [32];
  undefined1 auStack_148 [8];
  ChosenActions chosenActions;
  pointer local_100;
  undefined1 local_f8 [8];
  InliningState state;
  Builder builder;
  pointer __ptr_3;
  pointer __ptr_1;
  
  this->module = module_;
  puVar5 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_418 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)0x1;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  uVar67 = 0;
LAB_008de45a:
  if (uVar67 <= (ulong)((long)puVar5 - (long)puVar6 >> 3)) {
    local_260 = (undefined1  [8])&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    pMVar73 = this->module;
    puVar69 = (pMVar73->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pMVar73->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar69 != puVar7) {
      do {
        std::
        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
        ::operator[](this_00,(key_type *)
                             (puVar69->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        puVar69 = puVar69 + 1;
      } while (puVar69 != puVar7);
      pMVar73 = this->module;
    }
    local_398._M_nxt = (_Hash_node_base *)&local_388;
    pcStack_390 = (code *)0x0;
    local_388._M_allocated_capacity._0_4_ = local_388._M_allocated_capacity._0_4_ & 0xffffff00;
    local_358 = 0;
    local_350.replacep = (Expression **)0x0;
    local_350.stack.usedFixed = 0;
    local_350.currModule = (Module *)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350.currFunction = (Function *)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_01072e50;
    pPVar8 = (this->super_Pass).runner;
    pNStack_278 = this_00;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
           *)&inlinedUses._M_h._M_single_bucket,pMVar73);
    pMVar75 = this->module;
    puVar9 = (pMVar75->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_350.currModule = pMVar75;
    for (puVar78 = (pMVar75->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar78 != puVar9;
        puVar78 = puVar78 + 1) {
      pMVar73 = (Module *)
                (puVar78->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(Expression **)
           &((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              *)((long)&pMVar73->functions + 8))->
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          == (Expression *)0x0) {
        pMVar73 = (Module *)((long)&pMVar73->globals + 0x10);
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(&local_350,(Expression **)pMVar73);
      }
    }
    puVar10 = (pMVar75->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar85 = (pMVar75->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar85 != puVar10;
        puVar85 = puVar85 + 1) {
      pMVar73 = (Module *)
                (puVar85->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(pointer *)((long)&pMVar73->functions + 0x10) != (pointer)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(&local_350,(Expression **)((long)&pMVar73->functions + 0x10));
        pMVar73 = (Module *)
                  (puVar85->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      puVar9 = *(pointer *)
                ((long)&(pMVar73->globals).
                        super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                + 0x10);
      for (puVar78 = *(pointer *)
                      ((long)&(pMVar73->globals).
                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      + 8); puVar78 != puVar9; puVar78 = puVar78 + 1) {
        local_f8 = *(undefined1 (*) [8])
                    &(puVar78->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
        pMVar73 = (Module *)local_f8;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(&local_350,(Expression **)pMVar73);
      }
    }
    puVar11 = (pMVar75->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar86 = (pMVar75->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar86 != puVar11;
        puVar86 = puVar86 + 1) {
      pMVar73 = (Module *)
                (puVar86->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (*(long *)&(pMVar73->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data != 0) {
        pMVar73 = (Module *)&pMVar73->globals;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk(&local_350,(Expression **)pMVar73);
      }
    }
    local_350.currModule = (Module *)0x0;
    if (local_350.stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pMVar73 = (Module *)
                ((long)local_350.stack.flexible.
                       super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_350.stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      operator_delete(local_350.stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)pMVar73);
    }
    Pass::~Pass((Pass *)&inlinedUses._M_h._M_single_bucket);
    pMVar75 = this->module;
    puVar68 = (pMVar75->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (pMVar75->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar68 != puVar12) {
      do {
        pMVar73 = (Module *)
                  (puVar68->_M_t).
                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(int *)((long)&pMVar73->exports + 0x10) == 0) {
          if (*(char *)((long)&(pMVar73->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       + 0x10) == '\0') {
            pMVar73 = (Module *)&pMVar73->functions;
          }
          else {
            pMVar73 = (Module *)0x0;
          }
          pmVar43 = std::
                    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                    ::operator[](this_00,(key_type *)pMVar73);
          pmVar43->usedGlobally = true;
        }
        puVar68 = puVar68 + 1;
      } while (puVar68 != puVar12);
      pMVar75 = this->module;
    }
    if ((pMVar75->start).super_IString.str._M_str != (char *)0x0) {
      pMVar73 = (Module *)&pMVar75->start;
      pmVar43 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar73);
      pmVar43->usedGlobally = true;
      pMVar75 = this->module;
    }
    pPVar13 = (this->super_Pass).runner;
    if (((2 < (pPVar13->options).optimizeLevel) && ((pPVar13->options).shrinkLevel == 0)) &&
       ((pPVar13->options).inlining.partialInliningIfs != 0)) {
      pFVar44 = (FunctionSplitter *)operator_new(0x48);
      pFVar44->module = pMVar75;
      pFVar44->options = &pPVar13->options;
      (pFVar44->splits)._M_h._M_buckets = (__node_base_ptr *)((long)&(pFVar44->splits)._M_h + 0x30);
      *(size_type *)((long)&(pFVar44->splits)._M_h + 8) = 1;
      ((__node_base *)((long)&(pFVar44->splits)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
      *(size_type *)((long)&(pFVar44->splits)._M_h + 0x18) = 0;
      ((_Prime_rehash_policy *)((long)&(pFVar44->splits)._M_h + 0x20))->_M_max_load_factor = 1.0;
      *(size_t *)((long)&(pFVar44->splits)._M_h + 0x28) = 0;
      *(__node_base_ptr *)((long)&(pFVar44->splits)._M_h + 0x30) = (__node_base_ptr)0x0;
      pFVar14 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar44;
      if (pFVar14 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar14,
                   (FunctionSplitter *)pMVar73);
        pMVar75 = this->module;
      }
    }
    local_f8 = (undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize;
    state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
    state.inlinableFunctions._M_h._M_bucket_count = 0;
    state.inlinableFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    this_03 = (BranchSeeker *)&DAT_3f800000;
    state.inlinableFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
    state.inlinableFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.inlinableFunctions._M_h._M_rehash_policy._4_4_ = 0;
    state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
    state.inlinableFunctions._M_h._M_single_bucket =
         (__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)0x1;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    puVar69 = (pMVar75->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pMVar75->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar69 != puVar7) {
LAB_008de7b5:
      pFVar48 = (puVar69->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar48->super_Importable).module + 8) == (char *)0x0) {
        tree_00 = *(BranchSeeker **)&(pFVar48->super_Importable).super_Named;
        chosenActions._M_h._M_buckets =
             *(__buckets_ptr *)((long)&(pFVar48->super_Importable).super_Named + 8);
        NVar93.super_IString.str = *(IString *)&(pFVar48->super_Importable).super_Named;
        auStack_148 = (undefined1  [8])tree_00;
        pFVar45 = Module::getFunction(this->module,
                                      (IString)*(IString *)&(pFVar48->super_Importable).super_Named)
        ;
        this_03 = (BranchSeeker *)auStack_148;
        this_01 = (BranchSeeker *)
                  std::
                  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                  ::operator[](this_00,(key_type *)this_03);
        uVar58 = *(uint *)&(this_01->
                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           ).
                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           .stack.fixed._M_elems[0].func;
        pcVar59 = (char *)(ulong)uVar58;
        if (uVar58 == 0) {
          if (pFVar45->noFullInline != false) {
LAB_008de848:
            pBVar89 = this_03;
            if ((pFVar45->noPartialInline == false) &&
               (pFVar14 = (this->functionSplitter)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                          ._M_head_impl, pFVar14 != (FunctionSplitter *)0x0)) {
              pFVar45 = Module::getFunction(this->module,NVar93);
              uVar58 = (pFVar14->options->inlining).partialInliningIfs;
              if (uVar58 == 0) {
                __assert_fail("MaxIfs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                              ,0x335,
                              "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                             );
              }
              this_03 = (BranchSeeker *)pFVar45->body;
              cVar40 = *(char *)&(this_03->
                                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 ).
                                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 .replacep;
              tree = this_03;
              cVar84 = cVar40;
              if (cVar40 != '\x01') goto LAB_008de8fc;
              tree_00 = (BranchSeeker *)
                        (this_03->
                        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        ).
                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                        .stack.fixed._M_elems[0].func;
              NVar93.super_IString.str._M_str = pcVar59;
              NVar93.super_IString.str._M_len =
                   (size_t)(this_03->
                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           ).
                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           .stack.fixed._M_elems[0].currp;
              bVar39 = BranchUtils::BranchSeeker::has(this_03,(Expression *)tree_00,NVar93);
              pBVar89 = tree_00;
              if (bVar39) goto LAB_008dea4c;
              cVar40 = *(char *)&(this_03->
                                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 ).
                                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 .replacep;
              cVar84 = cVar40;
              if (cVar40 == '\x01') {
                if (((this_03->
                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     ).
                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     .stack.fixed._M_elems[1].currp != (Expression **)0x0) &&
                   (tree = *(BranchSeeker **)
                            (this_03->
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            ).
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.fixed._M_elems[1].func, tree != (BranchSeeker *)0x0)) {
                  cVar40 = *(char *)&(tree->
                                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     ).
                                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     .replacep;
                  cVar84 = '\x01';
                  goto LAB_008de8fc;
                }
              }
              else {
LAB_008de8fc:
                if ((cVar40 == '\x02') &&
                   (bVar39 = FunctionSplitter::isSimple
                                       ((FunctionSplitter *)
                                        (tree->
                                        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                        ).
                                        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                        .stack.fixed._M_elems[0].func,(Expression *)tree_00), bVar39
                   )) {
                  if ((tree->
                      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      .stack.fixed._M_elems[1].func != (TaskFunc)0x0) {
LAB_008de9a9:
                    ppEVar79 = (Expression **)0x0;
                    do {
                      uVar77 = (uint)ppEVar79;
                      pBVar89 = this_03;
                      if ((cVar84 == '\x01') &&
                         (ppEVar87 = (this_03->
                                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     ).
                                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     .stack.fixed._M_elems[1].currp, ppEVar79 < ppEVar87)) {
                        pcVar59 = *(char **)((this_03->
                                             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             ).
                                             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                             .stack.fixed._M_elems[1].func + (long)ppEVar79 * 8);
                        if (pcVar59 == (char *)0x0) {
                          if (uVar58 <= uVar77 - 1) goto LAB_008dea4c;
                          goto LAB_008dea14;
                        }
                        cVar40 = *pcVar59;
                      }
                      else {
                        cVar40 = cVar84;
                        if (uVar77 != 0) goto LAB_008de9f1;
                      }
                      if ((uVar58 < uVar77) || (cVar40 != '\x02')) goto LAB_008de9f1;
                      ppEVar79 = (Expression **)(ulong)(uVar77 + 1);
                    } while( true );
                  }
                  SVar90 = HeapType::getSignature(&pFVar45->type);
                  if (SVar90.results.id.id != 0) {
                    cVar84 = *(char *)&(this_03->
                                       super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       ).
                                       super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                       .replacep;
                    goto LAB_008de9a9;
                  }
                  cVar84 = *(char *)&(this_03->
                                     super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     ).
                                     super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                     .replacep;
                  if (*(char *)(tree->
                               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               ).
                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                               .stack.fixed._M_elems[0].currp != '\x13') goto LAB_008de9a9;
                  if (cVar84 != '\x01') {
                    __assert_fail("body->is<Block>()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x358,
                                  "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                                 );
                  }
                  iVar2 = *(int *)((long)&(this_01->
                                          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                          ).
                                          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                          .replacep + 4);
                  IVar42 = Measurer::measure((Expression *)tree);
                  this_03 = tree_00;
                  if (pFVar45->noFullInline == false) {
                    this_03 = this_01;
                    bVar39 = FunctionSplitter::outlinedFunctionWorthInlining
                                       (pFVar14,(FunctionInfo *)this_01,iVar2 - IVar42);
                    pcVar59 = (char *)0x2;
                    if (bVar39) goto LAB_008deb5d;
                  }
                  pcVar59 = (char *)0x3;
                  goto LAB_008deb5d;
                }
              }
              goto LAB_008deb54;
            }
            goto LAB_008dea4c;
          }
          this_03 = (BranchSeeker *)&((this->super_Pass).runner)->options;
          bVar39 = FunctionInfo::worthFullInlining((FunctionInfo *)this_01,(PassOptions *)this_03);
          pcVar59 = (char *)0x2;
          if (!bVar39) goto LAB_008de848;
          goto LAB_008deb5d;
        }
        goto LAB_008deb60;
      }
      goto LAB_008ded67;
    }
    goto LAB_008dfabc;
  }
  goto LAB_008dfdc2;
LAB_008de9f1:
  if (uVar77 - 1 < uVar58) {
    if (cVar84 == '\x01') {
      ppEVar87 = (this_03->
                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 ).
                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 .stack.fixed._M_elems[1].currp;
LAB_008dea14:
      if (ppEVar79 < ppEVar87) {
        p_Var15 = (this_03->
                  super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  .stack.fixed._M_elems[1].func;
        pFVar44 = *(FunctionSplitter **)(p_Var15 + (long)ppEVar79 * 8);
        if (pFVar44 != (FunctionSplitter *)0x0) {
          tree_00 = this_03;
          bVar39 = FunctionSplitter::isSimple(pFVar44,(Expression *)this_03);
          if (!bVar39) {
LAB_008deb54:
            this_03 = tree_00;
            pcVar59 = (char *)0x1;
            goto LAB_008deb5d;
          }
          if (((Expression **)(ulong)(uVar77 + 1) < ppEVar87) &&
             (*(long *)(p_Var15 + (long)(ulong)(uVar77 + 1) * 8) != 0)) goto LAB_008dea4c;
        }
      }
    }
    ppEVar87 = (Expression **)0x0;
    do {
      cVar40 = *(char *)&(this_03->
                         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         ).
                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         .replacep;
      pBVar89 = this_03;
      if ((cVar40 == '\x01') &&
         (ppEVar87 <
          (this_03->
          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          ).
          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          .stack.fixed._M_elems[1].currp)) {
        pBVar89 = *(BranchSeeker **)
                   ((this_03->
                    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    ).
                    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    .stack.fixed._M_elems[1].func + (long)ppEVar87 * 8);
        cVar40 = *(char *)&(pBVar89->
                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           ).
                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           .replacep;
      }
      if (cVar40 != '\x02') {
        pBVar89 = (BranchSeeker *)0x0;
      }
      tree_00 = this_03;
      bVar39 = FunctionSplitter::isSimple
                         ((FunctionSplitter *)
                          (pBVar89->
                          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                          ).
                          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                          .stack.fixed._M_elems[0].func,(Expression *)this_03);
      if ((!bVar39) ||
         ((pBVar89->
          super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          ).
          super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
          .stack.fixed._M_elems[1].func != (TaskFunc)0x0)) goto LAB_008deb54;
      tree_00 = (BranchSeeker *)
                (pBVar89->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.fixed._M_elems[0].currp;
      sVar16 = (tree_00->
               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               ).
               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
               .stack.usedFixed;
      if (sVar16 != 1) {
        if (sVar16 != 0) {
          __assert_fail("iff->ifTrue->type == Type::unreachable",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                        ,0x3ad,
                        "InliningMode wasm::(anonymous namespace)::FunctionSplitter::getSplitDrivenInliningMode(Function *, FunctionInfo &)"
                       );
        }
        FindAll<wasm::Return>::FindAll
                  ((FindAll<wasm::Return> *)&inlinedUses._M_h._M_single_bucket,(Expression *)tree_00
                  );
        p_Var36 = inlinedUses._M_h._M_single_bucket;
        if (inlinedUses._M_h._M_single_bucket != (__node_base_ptr)0x0) {
          tree_00 = (BranchSeeker *)
                    ((long)local_398._M_nxt - (long)inlinedUses._M_h._M_single_bucket);
          operator_delete(inlinedUses._M_h._M_single_bucket,(ulong)tree_00);
        }
        if ((PassRunner *)p_Var36 != pPVar8) goto LAB_008deb54;
      }
      ppEVar87 = (Expression **)((long)ppEVar87 + 1);
    } while (ppEVar79 != ppEVar87);
    if (uVar77 == 1) {
      IVar42 = Measurer::measure((Expression *)
                                 (tree->
                                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 ).
                                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 .stack.fixed._M_elems[0].currp);
      if (pFVar45->noFullInline == false) {
        this_03 = this_01;
        bVar39 = FunctionSplitter::outlinedFunctionWorthInlining
                           (pFVar14,(FunctionInfo *)this_01,IVar42);
        pcVar59 = (char *)0x2;
        if (bVar39) goto LAB_008deb5d;
      }
      pcVar59 = (char *)0x4;
    }
    else {
      pcVar59 = (char *)0x4;
    }
  }
  else {
LAB_008dea4c:
    this_03 = pBVar89;
    pcVar59 = (char *)0x1;
  }
LAB_008deb5d:
  uVar58 = (uint)pcVar59;
  *(uint *)&(this_01->
            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            ).
            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            .stack.fixed._M_elems[0].func = uVar58;
LAB_008deb60:
  if (uVar58 != 1) {
    pcVar59 = *(char **)((long)&(pFVar48->super_Importable).super_Named + 8);
    __key = (key_type *)((ulong)pcVar59 % (ulong)state.inlinableFunctions._M_h._M_buckets);
    this_03 = (BranchSeeker *)state.inlinableFunctions._M_h._M_buckets;
    p_Var46 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_node((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_f8,(size_type)state.inlinableFunctions._M_h._M_buckets,__key,
                             (__hash_code)pcVar59);
    if (p_Var46 == (__node_ptr)0x0) {
      p_Var46 = (__node_ptr)operator_new(0x28);
      (p_Var46->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      pcVar30 = *(char **)((long)&(pFVar48->super_Importable).super_Named + 8);
      (p_Var46->
      super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
      ._M_storage._M_storage.__align =
           *(anon_struct_8_0_00000001_for___align *)&(pFVar48->super_Importable).super_Named;
      *(char **)((long)&(p_Var46->
                        super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                        ._M_storage._M_storage + 8) = pcVar30;
      *(undefined4 *)
       ((long)&(p_Var46->
               super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
               ._M_storage._M_storage + 0x10) = 0;
      this_03 = (BranchSeeker *)state.inlinableFunctions._M_h._M_buckets;
      auVar91 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&state.inlinableFunctions._M_h._M_element_count,
                           (ulong)state.inlinableFunctions._M_h._M_buckets,
                           (ulong)state.inlinableFunctions._M_h._M_before_begin._M_nxt);
      __n = auVar91._8_8_;
      if ((auVar91 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (__n == (__buckets_ptr)0x1) {
          state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize = 0;
          __s = (Global *)&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize;
        }
        else {
          __s = (Global *)
                __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)
                           &inlinedUses._M_h._M_single_bucket,(size_type)__n,(void *)0x0);
          this_03 = (BranchSeeker *)0x0;
          memset(__s,0,(long)__n * 8);
        }
        _Var60._M_nxt = (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
        state.inlinableFunctions._M_h._M_bucket_count = 0;
        if (_Var60._M_nxt != (_Hash_node_base *)0x0) {
          uVar62 = 0;
          do {
            this_03 = (BranchSeeker *)
                      (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         *)&(_Var60._M_nxt)->_M_nxt)->
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      ).replacep;
            uVar64 = (((IString *)&((Task *)(_Var60._M_nxt + 4))->func)->str)._M_len % (ulong)__n;
            p_Var88 = *(__node_base_ptr *)
                       ((long)&(__s->super_Importable).super_Named.name + uVar64 * 8);
            if (p_Var88 == (_Hash_node_base *)0x0) {
              (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 *)&(_Var60._M_nxt)->_M_nxt)->
              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              ).replacep = (Expression **)state.inlinableFunctions._M_h._M_bucket_count;
              state.inlinableFunctions._M_h._M_bucket_count = (size_type)_Var60._M_nxt;
              *(size_type **)((long)&(__s->super_Importable).super_Named.name + uVar64 * 8) =
                   &state.inlinableFunctions._M_h._M_bucket_count;
              if ((((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                     *)&(_Var60._M_nxt)->_M_nxt)->
                  super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                  ).replacep != (Expression **)0x0) {
                pp_Var47 = (__node_base_ptr *)
                           ((long)&(__s->super_Importable).super_Named.name + uVar62 * 8);
                goto LAB_008dec9d;
              }
            }
            else {
              (((PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 *)&(_Var60._M_nxt)->_M_nxt)->
              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              ).replacep = (Expression **)p_Var88->_M_nxt;
              pp_Var47 = *(__node_base_ptr **)
                          ((long)&(__s->super_Importable).super_Named.name + uVar64 * 8);
              uVar64 = uVar62;
LAB_008dec9d:
              *pp_Var47 = _Var60._M_nxt;
            }
            _Var60._M_nxt = (_Hash_node_base *)this_03;
            uVar62 = uVar64;
          } while (this_03 != (BranchSeeker *)0x0);
        }
        if ((undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize !=
            local_f8) {
          this_03 = (BranchSeeker *)((long)state.inlinableFunctions._M_h._M_buckets << 3);
          operator_delete((void *)local_f8,(ulong)this_03);
        }
        state.inlinableFunctions._M_h._M_buckets = __n;
        local_f8 = (undefined1  [8])__s;
        __key = (key_type *)((ulong)pcVar59 % (ulong)__n);
      }
      (p_Var46->
      super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)pcVar59;
      p_Var88 = *(__node_base_ptr *)((long)local_f8 + (long)__key * 8);
      if (p_Var88 == (_Hash_node_base *)0x0) {
        (p_Var46->super__Hash_node_base)._M_nxt =
             (_Hash_node_base *)state.inlinableFunctions._M_h._M_bucket_count;
        if (state.inlinableFunctions._M_h._M_bucket_count != 0) {
          *(__node_ptr *)
           ((long)local_f8 +
           (*(ulong *)(state.inlinableFunctions._M_h._M_bucket_count + 0x20) %
           (ulong)state.inlinableFunctions._M_h._M_buckets) * 8) = p_Var46;
        }
        *(size_type **)((long)local_f8 + (long)__key * 8) =
             &state.inlinableFunctions._M_h._M_bucket_count;
        state.inlinableFunctions._M_h._M_bucket_count = (size_type)p_Var46;
      }
      else {
        (p_Var46->super__Hash_node_base)._M_nxt = p_Var88->_M_nxt;
        (*(__node_base_ptr *)((long)local_f8 + (long)__key * 8))->_M_nxt =
             (_Hash_node_base *)p_Var46;
      }
      state.inlinableFunctions._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           ((long)&(state.inlinableFunctions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
    }
    *(uint *)((long)&(p_Var46->
                     super__Hash_node_value<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::InliningMode>_>
                     ._M_storage._M_storage + 0x10) = uVar58;
  }
LAB_008ded67:
  puVar69 = puVar69 + 1;
  if (puVar69 == puVar7) goto LAB_008ded97;
  goto LAB_008de7b5;
LAB_008ded97:
  pp_Var47 = &inlinedUses._M_h._M_single_bucket;
  if (state.inlinableFunctions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    func_2 = (Function *)0x0;
    funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar73 = this->module;
    puVar69 = (pMVar73->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pMVar73->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar69 != puVar7) {
      do {
        std::
        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      *)&state.inlinableFunctions._M_h._M_single_bucket,
                     (key_type *)
                     (puVar69->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pFVar48 = (puVar69->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&func_2,
                     (iterator)
                     funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_start,(Name *)pFVar48);
        }
        else {
          pcVar59 = *(char **)((long)&(pFVar48->super_Importable).super_Named + 8);
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               *(size_t *)&(pFVar48->super_Importable).super_Named;
          ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar59;
          funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        puVar69 = puVar69 + 1;
      } while (puVar69 != puVar7);
      pMVar73 = this->module;
    }
    local_398._M_nxt = (_Hash_node_base *)&local_388;
    pcStack_390 = (code *)0x0;
    local_388._M_allocated_capacity._0_4_ = local_388._M_allocated_capacity._0_4_ & 0xffffff00;
    local_358 = 0;
    local_350.replacep = (Expression **)0x0;
    local_350.stack.usedFixed = 0;
    local_350.currModule = (Module *)0x0;
    pNStack_278 = (NameInfoMap *)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350.currFunction = (Function *)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_350.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_01072eb0;
    local_270 = local_f8;
    WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
    ::run((WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
           *)pp_Var47,pMVar73);
    if (local_350.stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pMVar73 = (Module *)
                ((long)local_350.stack.flexible.
                       super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_350.stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      operator_delete(local_350.stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)pMVar73);
    }
    Pass::~Pass((Pass *)pp_Var47);
    pNVar37 = funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start;
    auStack_148 = (undefined1  [8])&chosenActions._M_h._M_rehash_policy._M_next_resize;
    chosenActions._M_h._M_buckets = (__buckets_ptr)0x1;
    chosenActions._M_h._M_bucket_count = 0;
    chosenActions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    chosenActions._M_h._M_element_count._0_4_ = 0x3f800000;
    chosenActions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    chosenActions._M_h._M_rehash_policy._4_4_ = 0;
    chosenActions._M_h._M_rehash_policy._M_next_resize = 0;
    iterationCounts._M_h._M_single_bucket =
         (__node_base_ptr)&inlinedUses._M_h._M_rehash_policy._M_next_resize;
    inlinedUses._M_h._M_buckets = (__buckets_ptr)0x1;
    inlinedUses._M_h._M_bucket_count = 0;
    inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
    inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
    pFVar48 = func_2;
    if (func_2 != (Function *)
                  funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start) {
      do {
        auStack_208 = (undefined1  [8])
                      (pFVar48->super_Importable).super_Named.name.super_IString.str._M_len;
        name.super_IString.str._M_len =
             (size_t)(pFVar48->super_Importable).super_Named.name.super_IString.str._M_str;
        pMVar73 = (Module *)
                  Module::getFunction(this->module,
                                      (Name)(pFVar48->super_Importable).super_Named.name.
                                            super_IString.str);
        local_190 = pMVar73;
        sVar49 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&iterationCounts._M_h._M_single_bucket,(key_type *)pMVar73);
        if (sVar49 == 0) {
          pMVar73 = (Module *)auStack_208;
          pmVar50 = std::
                    unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                    ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                  *)&state.inlinableFunctions._M_h._M_single_bucket,
                                 (key_type *)pMVar73);
          pIVar17 = (pmVar50->
                    super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar63 = (pmVar50->
                         super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                         )._M_impl.super__Vector_impl_data._M_start; pIVar63 != pIVar17;
              pIVar63 = pIVar63 + 1) {
            pFVar45 = pIVar63->contents;
            pMVar73 = (Module *)((ulong)pFVar45 % (ulong)inlinedInto._M_h._M_buckets);
            if (*(long **)((long)local_260 + pMVar73 * 8) != (long *)0x0) {
              plVar70 = (long *)**(long **)((long)local_260 + pMVar73 * 8);
              pFVar52 = (Function *)plVar70[1];
              do {
                if (pFVar45 == pFVar52) goto LAB_008df8ec;
                plVar70 = (long *)*plVar70;
              } while ((plVar70 != (long *)0x0) &&
                      (pFVar52 = (Function *)plVar70[1],
                      (Module *)((ulong)pFVar52 % (ulong)inlinedInto._M_h._M_buckets) == pMVar73));
            }
            auStack_1b8 = (undefined1  [8])
                          (pFVar45->super_Importable).super_Named.name.super_IString.str._M_len;
            inlinedName.super_IString.str._M_len =
                 (size_t)(pFVar45->super_Importable).super_Named.name.super_IString.str._M_str;
            inlinedUses._M_h._M_single_bucket =
                 (__node_base_ptr)
                 (((Importable *)&local_190->exports)->super_Named).name.super_IString.str._M_len;
            local_168._0_8_ = auStack_1b8;
            local_168._8_8_ = inlinedName.super_IString.str._M_len;
            pmVar43 = std::
                      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                      ::operator[](this_00,(key_type *)&inlinedUses._M_h._M_single_bucket);
            IVar42 = pmVar43->size;
            pMVar73 = (Module *)local_168;
            pmVar43 = std::
                      unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                      ::operator[](this_00,(key_type *)pMVar73);
            if ((double)(IVar42 + pmVar43->size) * 2.5 < 409600.0) {
              pFVar45 = pIVar63->contents;
              pmVar43 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)pFVar45);
              IVar3 = pmVar43->inliningMode;
              pFVar52 = pFVar45;
              if (IVar3 != Full) {
                pFVar14 = (this->functionSplitter)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                          ._M_head_impl;
                if (pFVar14 == (FunctionSplitter *)0x0) {
                  __assert_fail("functionSplitter",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                ,0x5a3,
                                "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                               );
                }
                if (1 < IVar3 - SplitPatternA) {
                  __assert_fail("inliningMode == InliningMode::SplitPatternA || inliningMode == InliningMode::SplitPatternB"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                ,0x3c9,
                                "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *, InliningMode)"
                               );
                }
                p_Var88 = (_Hash_node_base *)
                          (pFVar45->super_Importable).super_Named.name.super_IString.str._M_str;
                builder_00 = (_Hash_node_base *)(pFVar14->splits)._M_h._M_buckets;
                uVar62 = *(size_type *)((long)&(pFVar14->splits)._M_h + 8);
                uVar64 = (ulong)p_Var88 % uVar62;
                if (builder_00[uVar64]._M_nxt != (__node_base_ptr)0x0) {
                  p_Var76 = (builder_00[uVar64]._M_nxt)->_M_nxt;
                  p_Var18 = p_Var76[5]._M_nxt;
                  do {
                    if ((p_Var18 == p_Var88) && (p_Var76[2]._M_nxt == p_Var88)) goto LAB_008df2d7;
                    p_Var76 = p_Var76->_M_nxt;
                  } while ((p_Var76 != (_Hash_node_base *)0x0) &&
                          (builder_00 = p_Var76[5]._M_nxt, p_Var18 = builder_00,
                          (ulong)builder_00 % uVar62 == uVar64));
                }
                builder_00 = (_Hash_node_base *)operator_new(0x30);
                builder_00->_M_nxt = (_Hash_node_base *)0x0;
                p_Var76 = (_Hash_node_base *)
                          (pFVar45->super_Importable).super_Named.name.super_IString.str._M_str;
                builder_00[1]._M_nxt =
                     (_Hash_node_base *)
                     (pFVar45->super_Importable).super_Named.name.super_IString.str._M_len;
                builder_00[2]._M_nxt = p_Var76;
                builder_00[3]._M_nxt = (_Hash_node_base *)0x0;
                builder_00[4]._M_nxt = (_Hash_node_base *)0x0;
                auVar91 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                    ((ulong)((long)&(pFVar14->splits)._M_h + 0x20),
                                     *(size_type *)((long)&(pFVar14->splits)._M_h + 8),
                                     *(size_type *)((long)&(pFVar14->splits)._M_h + 0x18));
                __n_00 = auVar91._8_8_;
                if ((auVar91 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  __s_00 = (pFVar14->splits)._M_h._M_buckets;
                }
                else {
                  if (__n_00 == 1) {
                    __s_00 = (__node_base_ptr *)((long)&(pFVar14->splits)._M_h + 0x30);
                    *(__node_base_ptr *)((long)&(pFVar14->splits)._M_h + 0x30) =
                         (__node_base_ptr)0x0;
                  }
                  else {
                    __s_00 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                       ((new_allocator<std::__detail::_Hash_node_base_*> *)
                                        &inlinedUses._M_h._M_single_bucket,__n_00,(void *)0x0);
                    memset(__s_00,0,__n_00 * 8);
                  }
                  _Var74._M_nxt = ((__node_base *)((long)&(pFVar14->splits)._M_h + 0x10))->_M_nxt;
                  ((__node_base *)((long)&(pFVar14->splits)._M_h + 0x10))->_M_nxt =
                       (_Hash_node_base *)0x0;
                  if (_Var74._M_nxt != (_Hash_node_base *)0x0) {
                    p_Var33 = (__node_base *)((long)&(pFVar14->splits)._M_h + 0x10);
                    uVar62 = 0;
                    do {
                      p_Var76 = (_Var74._M_nxt)->_M_nxt;
                      uVar64 = (ulong)_Var74._M_nxt[5]._M_nxt % __n_00;
                      if (__s_00[uVar64] == (__node_base_ptr)0x0) {
                        (_Var74._M_nxt)->_M_nxt = p_Var33->_M_nxt;
                        p_Var33->_M_nxt = _Var74._M_nxt;
                        __s_00[uVar64] = p_Var33;
                        if ((_Var74._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                          pp_Var51 = __s_00 + uVar62;
                          goto LAB_008df228;
                        }
                      }
                      else {
                        (_Var74._M_nxt)->_M_nxt = __s_00[uVar64]->_M_nxt;
                        pp_Var51 = &__s_00[uVar64]->_M_nxt;
                        uVar64 = uVar62;
LAB_008df228:
                        *pp_Var51 = _Var74._M_nxt;
                      }
                      _Var74._M_nxt = p_Var76;
                      uVar62 = uVar64;
                    } while (p_Var76 != (_Hash_node_base *)0x0);
                  }
                  pp_Var19 = (pFVar14->splits)._M_h._M_buckets;
                  if ((__node_base_ptr *)((long)&(pFVar14->splits)._M_h + 0x30U) != pp_Var19) {
                    operator_delete(pp_Var19,*(size_type *)((long)&(pFVar14->splits)._M_h + 8) << 3)
                    ;
                  }
                  *(size_type *)((long)&(pFVar14->splits)._M_h + 8) = __n_00;
                  (pFVar14->splits)._M_h._M_buckets = __s_00;
                  uVar64 = (ulong)p_Var88 % __n_00;
                }
                builder_00[5]._M_nxt = p_Var88;
                if (__s_00[uVar64] == (__node_base_ptr)0x0) {
                  p_Var88 = ((__node_base *)((long)&(pFVar14->splits)._M_h + 0x10))->_M_nxt;
                  builder_00->_M_nxt = p_Var88;
                  ((__node_base *)((long)&(pFVar14->splits)._M_h + 0x10))->_M_nxt = builder_00;
                  if (p_Var88 != (_Hash_node_base *)0x0) {
                    __s_00[(ulong)p_Var88[5]._M_nxt %
                           *(size_type *)((long)&(pFVar14->splits)._M_h + 8)] = builder_00;
                    __s_00 = (pFVar14->splits)._M_h._M_buckets;
                  }
                  __s_00[uVar64] = (__node_base *)((long)&(pFVar14->splits)._M_h + 0x10);
                }
                else {
                  builder_00->_M_nxt = __s_00[uVar64]->_M_nxt;
                  __s_00[uVar64]->_M_nxt = builder_00;
                }
                psVar34 = (size_type *)((long)&(pFVar14->splits)._M_h + 0x18);
                *psVar34 = *psVar34 + 1;
                p_Var76 = builder_00;
LAB_008df2d7:
                pFVar52 = (Function *)p_Var76[3]._M_nxt;
                if ((Function *)p_Var76[3]._M_nxt == (Function *)0x0) {
                  state.actionsForFunction._M_h._M_single_bucket = (__node_base_ptr)pFVar14->module;
                  if (IVar3 == SplitPatternB) {
                    local_1e8 = (pointer)0x6261656e696c6e69;
                    local_1e0 = 0x422d656c;
                    local_1dc = 0;
                    name.super_IString.str._M_str = (char *)&local_1e8;
                    pFVar52 = FunctionSplitter::copyFunction
                                        (pFVar14,pFVar45,(string *)&name.super_IString.str._M_str);
                    if ((pointer *)name.super_IString.str._M_str != &local_1e8) {
                      operator_delete(name.super_IString.str._M_str,
                                      (ulong)((long)&(local_1e8->_M_t).
                                                                                                          
                                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                                  .super__Head_base<0UL,_wasm::Function_*,_false>.
                                                  _M_head_impl + 1));
                    }
                    inlinedInto._M_h._M_single_bucket =
                         (__node_base_ptr)(ulong)(pFVar14->options->inlining).partialInliningIfs;
                    if (inlinedInto._M_h._M_single_bucket == (__node_base_ptr)0x0) {
                      __assert_fail("MaxIfs > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                    ,0x426,
                                    "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                   );
                    }
                    p_Var81 = (__node_base_ptr)0x0;
                    do {
                      paVar61 = &local_1d8.field_2;
                      pEVar80 = pFVar52->body;
                      IVar41 = pEVar80->_id;
                      if ((IVar41 == BlockId) && (p_Var81 < (__node_base_ptr)pEVar80[2].type.id)) {
                        pEVar80 = *(Expression **)(*(long *)(pEVar80 + 2) + (long)p_Var81 * 8);
                        if (pEVar80 == (Expression *)0x0) break;
                        IVar41 = pEVar80->_id;
                      }
                      else if (p_Var81 != (__node_base_ptr)0x0) break;
                      if (IVar41 != IfId) break;
                      local_1d8.field_2._M_allocated_capacity = 0x64656e696c74756f;
                      local_1d8.field_2._8_2_ = 0x422d;
                      local_1d8._M_string_length = 10;
                      local_1d8.field_2._M_local_buf[10] = '\0';
                      builder_01 = paVar61;
                      local_1d8._M_dataplus._M_p = (pointer)paVar61;
                      pFVar53 = FunctionSplitter::copyFunction(pFVar14,pFVar45,&local_1d8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1d8._M_dataplus._M_p != paVar61) {
                        operator_delete(local_1d8._M_dataplus._M_p,
                                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
                      }
                      pFVar53->body = (Expression *)pEVar80[1].type.id;
                      SVar90 = HeapType::getSignature(&pFVar45->type);
                      if ((SVar90.results.id.id == 0) || ((pFVar53->body->type).id == 0)) {
                        bVar39 = false;
                        TVar65.id = 0;
                      }
                      else {
                        SVar90 = HeapType::getSignature(&pFVar45->type);
                        TVar65 = SVar90.results.id;
                        bVar39 = true;
                      }
                      SVar92 = HeapType::getSignature(&pFVar53->type);
                      SVar90.results.id = TVar65.id;
                      SVar90.params.id = SVar92.params.id.id;
                      HeapType::HeapType((HeapType *)&chosenActions._M_h._M_single_bucket,SVar90);
                      (pFVar53->type).id = (uintptr_t)chosenActions._M_h._M_single_bucket;
                      sVar26 = (pFVar53->super_Importable).super_Named.name.super_IString.str;
                      FunctionSplitter::getForwardedArgs
                                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &chosenActions._M_h._M_single_bucket,(FunctionSplitter *)pFVar45,
                                 (Function *)&state.actionsForFunction._M_h._M_single_bucket,
                                 (Builder *)&builder_01->_M_allocated_capacity);
                      SVar90 = HeapType::getSignature(&pFVar53->type);
                      pCVar55 = Builder::makeCall((Builder *)
                                                  &state.actionsForFunction._M_h._M_single_bucket,
                                                  (Name)sVar26,
                                                  (
                                                  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                  *)&chosenActions._M_h._M_single_bucket,
                                                  SVar90.results.id,false);
                      pEVar80[1].type.id = (uintptr_t)pCVar55;
                      if (chosenActions._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                        operator_delete(chosenActions._M_h._M_single_bucket,
                                        (long)local_100 - (long)chosenActions._M_h._M_single_bucket)
                        ;
                      }
                      if (bVar39) {
                        uVar20 = pEVar80[1].type.id;
                        puVar54 = (undefined1 *)
                                  MixedArena::allocSpace
                                            ((MixedArena *)
                                             (state.actionsForFunction._M_h._M_single_bucket + 0x40)
                                             ,0x18,8);
                        *puVar54 = 0x13;
                        *(undefined8 *)(puVar54 + 8) = 1;
                        *(uintptr_t *)(puVar54 + 0x10) = uVar20;
                        pEVar80[1].type.id = (uintptr_t)puVar54;
                      }
                      p_Var81 = (__node_base_ptr)((long)&p_Var81->_M_nxt + 1);
                    } while (inlinedInto._M_h._M_single_bucket != p_Var81);
                  }
                  else {
                    if (IVar3 != SplitPatternA) {
                      __assert_fail("inliningMode == InliningMode::SplitPatternB",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                                    ,0x421,
                                    "Function *wasm::(anonymous namespace)::FunctionSplitter::doSplit(Function *, InliningMode)"
                                   );
                    }
                    local_398._M_nxt = (_Hash_node_base *)0x6261656e696c6e69;
                    pcStack_390 = (code *)CONCAT35(pcStack_390._5_3_,0x412d656c);
                    inlinedUses._M_h._M_single_bucket = &local_398;
                    pFVar52 = FunctionSplitter::copyFunction
                                        (pFVar14,pFVar45,
                                         (string *)&inlinedUses._M_h._M_single_bucket);
                    if (inlinedUses._M_h._M_single_bucket != &local_398) {
                      operator_delete(inlinedUses._M_h._M_single_bucket,
                                      (long)&(local_398._M_nxt)->_M_nxt + 1);
                    }
                    local_168._16_8_ = (pointer)0x64656e696c74756f;
                    local_168._24_2_ = 0x412d;
                    local_168._8_8_ = (pointer)0xa;
                    local_168[0x1a] = '\0';
                    local_168._0_8_ = (pointer)(local_168 + 0x10);
                    pFVar53 = FunctionSplitter::copyFunction(pFVar14,pFVar45,(string *)local_168);
                    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
                      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
                    }
                    pEVar80 = pFVar52->body;
                    IVar41 = pEVar80->_id;
                    if (IVar41 == BlockId) {
                      if ((pEVar80[2].type.id != 0) &&
                         (pEVar80 = (Expression *)**(long **)(pEVar80 + 2),
                         pEVar80 != (Expression *)0x0)) {
                        IVar41 = pEVar80->_id;
                        goto LAB_008df403;
                      }
                      pEVar80 = (Expression *)0x0;
                    }
                    else {
LAB_008df403:
                      if (IVar41 != IfId) {
                        pEVar80 = (Expression *)0x0;
                      }
                    }
                    pEVar21 = *(Expression **)(pEVar80 + 1);
                    this_02 = (Unary *)MixedArena::allocSpace
                                                 ((MixedArena *)
                                                  (state.actionsForFunction._M_h._M_single_bucket +
                                                  0x40),0x20,8);
                    (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                    _id = UnaryId;
                    (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.
                    type.id = 0;
                    this_02->op = EqZInt32;
                    this_02->value = pEVar21;
                    Unary::finalize(this_02);
                    *(Unary **)(pEVar80 + 1) = this_02;
                    sVar26 = (pFVar53->super_Importable).super_Named.name.super_IString.str;
                    FunctionSplitter::getForwardedArgs
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &chosenActions._M_h._M_single_bucket,(FunctionSplitter *)pFVar45,
                               (Function *)&state.actionsForFunction._M_h._M_single_bucket,
                               (Builder *)builder_00);
                    pCVar55 = Builder::makeCall((Builder *)
                                                &state.actionsForFunction._M_h._M_single_bucket,
                                                (Name)sVar26,
                                                (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                 *)&chosenActions._M_h._M_single_bucket,(Type)0x0,
                                                false);
                    pEVar80[1].type.id = (uintptr_t)pCVar55;
                    if (chosenActions._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                      operator_delete(chosenActions._M_h._M_single_bucket,
                                      (long)local_100 - (long)chosenActions._M_h._M_single_bucket);
                    }
                    pFVar52->body = pEVar80;
                    if (pFVar53->body->_id != BlockId) {
                      __assert_fail("int(_id) == int(T::SpecificId)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Block]");
                    }
                    end_it.parent = (ArenaVector<wasm::Expression_*> *)(pFVar53->body + 2);
                    start_it.index = 0;
                    start_it.parent = end_it.parent;
                    end_it.index = 1;
                    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)end_it.parent,start_it,end_it);
                  }
                  p_Var76[3]._M_nxt = (_Hash_node_base *)pFVar52;
                }
              }
              pIVar63->contents = pFVar52;
              IVar42 = this->inlinedNameHint;
              this->inlinedNameHint = IVar42 + 1;
              pIVar63->nameHint = IVar42;
              pMVar73 = local_190;
              pmVar50 = std::
                        unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                        ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                      *)auStack_148,(key_type *)local_190);
              pIVar22 = (pmVar50->
                        super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (pIVar22 ==
                  (pmVar50->
                  super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                pIVar23 = (pmVar50->
                          super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar82 = (long)pIVar22 - (long)pIVar23;
                if (lVar82 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar64 = (lVar82 >> 3) * -0x5555555555555555;
                uVar62 = uVar64;
                if (pIVar22 == pIVar23) {
                  uVar62 = 1;
                }
                this_04 = (_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                           *)(uVar62 + uVar64);
                if ((_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                     *)0x555555555555554 < this_04) {
                  this_04 = (_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                             *)0x555555555555555;
                }
                if (CARRY8(uVar62,uVar64)) {
                  this_04 = (_Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                             *)0x555555555555555;
                }
                pIVar56 = std::
                          _Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                          ::_M_allocate(this_04,(size_t)pMVar73);
                *(undefined8 *)((long)pIVar56 + lVar82 + 0x10) = *(undefined8 *)&pIVar63->insideATry
                ;
                pFVar45 = pIVar63->contents;
                *(undefined8 *)((long)pIVar56 + lVar82) = pIVar63->callSite;
                ((undefined8 *)((long)pIVar56 + lVar82))[1] = pFVar45;
                pIVar83 = pIVar56;
                for (pIVar66 = pIVar23; pIVar22 != pIVar66; pIVar66 = pIVar66 + 1) {
                  uVar35 = *(undefined3 *)&pIVar66->field_0x11;
                  IVar42 = pIVar66->nameHint;
                  pIVar83->insideATry = pIVar66->insideATry;
                  *(undefined3 *)&pIVar83->field_0x11 = uVar35;
                  pIVar83->nameHint = IVar42;
                  pFVar45 = pIVar66->contents;
                  pIVar83->callSite = pIVar66->callSite;
                  pIVar83->contents = pFVar45;
                  pIVar83 = pIVar83 + 1;
                }
                if (pIVar23 != (pointer)0x0) {
                  operator_delete(pIVar23,(long)(pmVar50->
                                                super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                                                )._M_impl.super__Vector_impl_data._M_end_of_storage
                                          - (long)pIVar23);
                }
                (pmVar50->
                super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                )._M_impl.super__Vector_impl_data._M_start = pIVar56;
                (pmVar50->
                super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                )._M_impl.super__Vector_impl_data._M_finish = pIVar83 + 1;
                (pmVar50->
                super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar56 + (long)this_04;
              }
              else {
                uVar35 = *(undefined3 *)&pIVar63->field_0x11;
                IVar42 = pIVar63->nameHint;
                pIVar22->insideATry = pIVar63->insideATry;
                *(undefined3 *)&pIVar22->field_0x11 = uVar35;
                pIVar22->nameHint = IVar42;
                pFVar45 = pIVar63->contents;
                pIVar22->callSite = pIVar63->callSite;
                pIVar22->contents = pFVar45;
                ppIVar1 = &(pmVar50->
                           super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + 1;
              }
              pmVar57 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&iterationCounts._M_h._M_single_bucket,
                                     (key_type *)auStack_1b8);
              *pmVar57 = *pmVar57 + 1;
              inlinedUses._M_h._M_single_bucket = (__node_base_ptr)local_260;
              std::
              _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                        ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)inlinedUses._M_h._M_single_bucket,&local_190,
                         &inlinedUses._M_h._M_single_bucket);
              pmVar57 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&iterationCounts._M_h._M_single_bucket,
                                     (key_type *)auStack_1b8);
              uVar58 = *pmVar57;
              pMVar73 = (Module *)auStack_1b8;
              pmVar43 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)pMVar73);
              if ((pmVar43->refs).super___atomic_base<unsigned_int>._M_i < uVar58) {
                __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                              ,0x555,
                              "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                             );
              }
            }
LAB_008df8ec:
          }
        }
        pMVar75 = (Module *)&inlinedUses._M_h._M_single_bucket;
        pFVar48 = (Function *)&(pFVar48->super_Importable).super_Named.hasExplicitName;
      } while (pFVar48 != (Function *)pNVar37);
      if (chosenActions._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        PassUtils::FilteredPassRunner::FilteredPassRunner
                  ((FilteredPassRunner *)pMVar75,this->module,(FuncSet *)local_260,
                   &((this->super_Pass).runner)->options);
        local_350.stack.fixed._M_elems[8].func._0_1_ = 1;
        local_168._0_8_ = operator_new(0x60);
        (((pointer)(local_168._0_8_ + 8))->_M_t).
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = (DataSegment *)0x0;
        (((pointer)(local_168._0_8_ + 0x10))->_M_t).
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             (DataSegment *)(local_168._0_8_ + 0x20);
        (((pointer)(local_168._0_8_ + 0x18))->_M_t).
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = (DataSegment *)0x0;
        *(undefined1 *)
         &(((pointer)(local_168._0_8_ + 0x20))->_M_t).
          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
          super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = 0;
        *(undefined1 *)
         &(((pointer)(local_168._0_8_ + 0x50))->_M_t).
          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
          super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = 0;
        (((pointer)local_168._0_8_)->_M_t).
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             (DataSegment *)&PTR__Pass_01072f10;
        (((pointer)(local_168._0_8_ + 0x58))->_M_t).
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = (DataSegment *)auStack_148;
        PassRunner::add((PassRunner *)pMVar75,
                        (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          (**(code **)((long)*(__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>
                               *)local_168._0_8_ + 8))();
        }
        local_168._0_8_ = (pointer)0x0;
        if (this->optimize == true) {
          OptUtils::addUsefulPassesAfterInlining((PassRunner *)pMVar75);
        }
        PassRunner::run((PassRunner *)pMVar75);
        PassRunner::~PassRunner((PassRunner *)pMVar75);
        pcStack_390 = std::
                      _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
                      ::_M_invoke;
        local_398._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:1389:29)>
             ::_M_manager;
        pMVar73 = pMVar75;
        inlinedUses._M_h._M_single_bucket = (__node_base_ptr)this;
        Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)pMVar75);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_nxt !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (*(code *)local_398._M_nxt)(pMVar75,pMVar75,3);
          pMVar73 = pMVar75;
        }
      }
    }
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&iterationCounts._M_h._M_single_bucket);
    p_Var32 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
               *)chosenActions._M_h._M_bucket_count;
    while (p_Var32 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
            *)0x0) {
      p_Var24 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                  **)p_Var32;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
      ::_M_deallocate_node(p_Var32,(__node_ptr)pMVar73);
      p_Var32 = p_Var24;
    }
    this_03 = (BranchSeeker *)0x0;
    memset((void *)auStack_148,0,(long)chosenActions._M_h._M_buckets << 3);
    chosenActions._M_h._M_bucket_count = 0;
    chosenActions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&chosenActions._M_h._M_rehash_policy._M_next_resize != auStack_148) {
      this_03 = (BranchSeeker *)((long)chosenActions._M_h._M_buckets << 3);
      operator_delete((void *)auStack_148,(ulong)this_03);
    }
    if (func_2 != (Function *)0x0) {
      this_03 = (BranchSeeker *)
                ((long)funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)func_2);
      operator_delete(func_2,(ulong)this_03);
    }
  }
LAB_008dfabc:
  pp_Var47 = &inlinedUses._M_h._M_single_bucket;
  p_Var32 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
             *)state.actionsForFunction._M_h._M_bucket_count;
  while (p_Var32 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
          *)0x0) {
    p_Var24 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                **)p_Var32;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
    ::_M_deallocate_node(p_Var32,(__node_ptr)this_03);
    p_Var32 = p_Var24;
  }
  memset(state.inlinableFunctions._M_h._M_single_bucket,0,
         (long)state.actionsForFunction._M_h._M_buckets << 3);
  state.actionsForFunction._M_h._M_bucket_count = 0;
  state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  puVar71 = (undefined8 *)state.inlinableFunctions._M_h._M_bucket_count;
  if ((__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize !=
      state.inlinableFunctions._M_h._M_single_bucket) {
    operator_delete(state.inlinableFunctions._M_h._M_single_bucket,
                    (long)state.actionsForFunction._M_h._M_buckets << 3);
    puVar71 = (undefined8 *)state.inlinableFunctions._M_h._M_bucket_count;
  }
  while (puVar71 != (undefined8 *)0x0) {
    puVar25 = (undefined8 *)*puVar71;
    operator_delete(puVar71,0x28);
    puVar71 = puVar25;
  }
  memset((void *)local_f8,0,(long)state.inlinableFunctions._M_h._M_buckets << 3);
  state.inlinableFunctions._M_h._M_bucket_count = 0;
  state.inlinableFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((undefined1  [8])&state.inlinableFunctions._M_h._M_rehash_policy._M_next_resize != local_f8) {
    operator_delete((void *)local_f8,(long)state.inlinableFunctions._M_h._M_buckets << 3);
  }
  if (inlinedInto._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
LAB_008dfdb6:
    std::
    _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_260);
    goto LAB_008dfdc2;
  }
  plVar70 = (long *)inlinedInto._M_h._M_bucket_count;
  if (inlinedInto._M_h._M_bucket_count != 0) {
    do {
      EHUtils::handleBlockNestedPops((Function *)plVar70[1],this->module,SkipIfNoEH);
      plVar70 = (long *)*plVar70;
      puVar71 = (undefined8 *)inlinedInto._M_h._M_bucket_count;
    } while (plVar70 != (long *)0x0);
    for (; puVar71 != (undefined8 *)0x0; puVar71 = (undefined8 *)*puVar71) {
      pmVar57 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_418,(key_type *)puVar71[1]);
      mVar4 = *pmVar57;
      *pmVar57 = mVar4 + 1;
      if (4 < mVar4 + 1) goto LAB_008dfdb6;
    }
  }
  pFVar14 = (this->functionSplitter)._M_t.
            super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
            .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
            _M_head_impl;
  if (pFVar14 != (FunctionSplitter *)0x0) {
    auStack_148 = (undefined1  [8])0x0;
    chosenActions._M_h._M_buckets = (__buckets_ptr)0x0;
    chosenActions._M_h._M_bucket_count = 0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)&_Stack_378;
    local_398._M_nxt = (_Hash_node_base *)0x0;
    pcStack_390 = (code *)0x0;
    local_388._M_allocated_capacity._0_4_ = 0x3f800000;
    local_388._8_8_ = 0;
    _Stack_378._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    for (p_Var88 = ((__node_base *)((long)&(pFVar14->splits)._M_h + 0x10))->_M_nxt;
        local_f8 = (undefined1  [8])pp_Var47, p_Var88 != (_Hash_node_base *)0x0;
        p_Var88 = p_Var88->_M_nxt) {
      if (p_Var88[3]._M_nxt != (_Hash_node_base *)0x0) {
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)pp_Var47,p_Var88[3]._M_nxt,local_f8);
        if (chosenActions._M_h._M_buckets == (__buckets_ptr)chosenActions._M_h._M_bucket_count) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_148,
                     (iterator)chosenActions._M_h._M_buckets,(Name *)(p_Var88 + 1));
        }
        else {
          uVar27 = *(undefined4 *)((long)&p_Var88[1]._M_nxt + 4);
          uVar28 = *(undefined4 *)&p_Var88[2]._M_nxt;
          uVar29 = *(undefined4 *)((long)&p_Var88[2]._M_nxt + 4);
          *(int *)chosenActions._M_h._M_buckets =
               (int)(((Name *)(p_Var88 + 1))->super_IString).str._M_len;
          *(undefined4 *)((long)chosenActions._M_h._M_buckets + 4) = uVar27;
          *(undefined4 *)(chosenActions._M_h._M_buckets + 1) = uVar28;
          *(undefined4 *)((long)chosenActions._M_h._M_buckets + 0xc) = uVar29;
          chosenActions._M_h._M_buckets = chosenActions._M_h._M_buckets + 2;
        }
      }
    }
    state.inlinableFunctions._M_h._M_buckets = (__buckets_ptr)0x0;
    state.inlinableFunctions._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)
         std::
         _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
         ::_M_invoke;
    state.inlinableFunctions._M_h._M_bucket_count =
         (size_type)
         std::
         _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp:995:29)>
         ::_M_manager;
    Module::removeFunctions(pFVar14->module,(function<bool_(wasm::Function_*)> *)local_f8);
    if (state.inlinableFunctions._M_h._M_bucket_count != 0) {
      (*(code *)state.inlinableFunctions._M_h._M_bucket_count)(local_f8,local_f8,3);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)pp_Var47);
    pp_Var38 = chosenActions._M_h._M_buckets;
    auVar72 = auStack_148;
    if (auStack_148 == (undefined1  [8])chosenActions._M_h._M_buckets) {
      bVar31 = false;
      bVar39 = true;
    }
    else {
      do {
        inlinedUses._M_h._M_single_bucket =
             (__node_base_ptr)
             (((BranchSeeker *)auVar72)->
             super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
             ).
             super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
             .replacep;
        pmVar57 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_418,(key_type *)pp_Var47);
        mVar4 = *pmVar57;
        *pmVar57 = mVar4 + 1;
        bVar39 = mVar4 + 1 < 5;
        if (!bVar39) {
          bVar31 = true;
          goto LAB_008dfd78;
        }
        auVar72 = (undefined1  [8])
                  &(((BranchSeeker *)auVar72)->
                   super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   ).
                   super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   .stack.fixed;
      } while (auVar72 != (undefined1  [8])pp_Var38);
      bVar31 = false;
    }
LAB_008dfd78:
    if (auStack_148 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_148,chosenActions._M_h._M_bucket_count - (long)auStack_148);
    }
    if (!bVar39) goto LAB_008dfd97;
  }
  bVar31 = false;
LAB_008dfd97:
  uVar67 = (ulong)((int)uVar67 + 1);
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_260);
  if (bVar31) {
LAB_008dfdc2:
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_418);
    return;
  }
  goto LAB_008de45a;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }